

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<int_()>::TypedExpectation
          (TypedExpectation<int_()> *this,FunctionMockerBase<int_()> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  MatcherInterface<const_std::tuple<>_&> *pMVar1;
  
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_0028fb68;
  this->owner_ = owner;
  pMVar1 = (MatcherInterface<const_std::tuple<>_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_0028fbe8;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>.impl_.value_ = pMVar1;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>.impl_.link_.next_ =
       &(this->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>.impl_.link_;
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0028fbb0;
  (this->repeated_action_).impl_.value_ = (ActionInterface<int_()> *)0x0;
  (this->repeated_action_).impl_.link_.next_ = &(this->repeated_action_).impl_.link_;
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}